

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O0

int isViableEndCityTerrain(Generator *g,SurfaceNoise *sn,int blockX,int blockZ)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint64_t uVar4;
  int in_ECX;
  int in_EDX;
  long in_RDI;
  uint64_t cs;
  int h11;
  int h10;
  int h01;
  int h00;
  double ncol [3] [3] [4];
  int cellz;
  int cellx;
  int chunkZ;
  int chunkX;
  EndNoise *en;
  int local_17c;
  undefined8 in_stack_fffffffffffffe88;
  uint64_t in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  SurfaceNoise *in_stack_fffffffffffffea8;
  double *in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffec0;
  double in_stack_fffffffffffffee8;
  double in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  double *in_stack_ffffffffffffff00;
  double *in_stack_ffffffffffffff08;
  double *in_stack_ffffffffffffff10;
  double *in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff30;
  
  sampleNoiseColumnEnd
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
             (EndNoise *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
             in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98,
             (int)(in_stack_fffffffffffffe90 >> 0x20),in_stack_fffffffffffffec0);
  sampleNoiseColumnEnd
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
             (EndNoise *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
             in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98,
             (int)(in_stack_fffffffffffffe90 >> 0x20),in_stack_fffffffffffffec0);
  sampleNoiseColumnEnd
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
             (EndNoise *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
             in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98,
             (int)(in_stack_fffffffffffffe90 >> 0x20),in_stack_fffffffffffffec0);
  sampleNoiseColumnEnd
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
             (EndNoise *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
             in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98,
             (int)(in_stack_fffffffffffffe90 >> 0x20),in_stack_fffffffffffffec0);
  local_17c = getSurfaceHeight(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                               in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                               in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,
                               in_stack_ffffffffffffff30,in_stack_fffffffffffffef0,
                               in_stack_fffffffffffffee8);
  if (*(int *)(in_RDI + 0x6bc0) < 0x17) {
    setSeed((uint64_t *)&stack0xfffffffffffffe90,
            (long)(in_EDX >> 4) + (long)(in_ECX >> 4) * 0x9e7f71);
    iVar2 = (int)(in_stack_fffffffffffffe90 >> 0x20);
  }
  else {
    uVar4 = chunkGenerateRnd(in_stack_fffffffffffffe90,
                             (int)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                             (int)in_stack_fffffffffffffe88);
    iVar2 = (int)(uVar4 >> 0x20);
  }
  iVar1 = nextInt((uint64_t *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),iVar2);
  switch(iVar1) {
  case 0:
    sampleNoiseColumnEnd
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
               (EndNoise *)CONCAT44(local_17c,in_stack_fffffffffffffea0),in_stack_fffffffffffffe9c,
               in_stack_fffffffffffffe98,iVar2,in_stack_fffffffffffffec0);
    sampleNoiseColumnEnd
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
               (EndNoise *)CONCAT44(local_17c,in_stack_fffffffffffffea0),in_stack_fffffffffffffe9c,
               in_stack_fffffffffffffe98,iVar2,in_stack_fffffffffffffec0);
    sampleNoiseColumnEnd
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
               (EndNoise *)CONCAT44(local_17c,in_stack_fffffffffffffea0),in_stack_fffffffffffffe9c,
               in_stack_fffffffffffffe98,iVar2,in_stack_fffffffffffffec0);
    sampleNoiseColumnEnd
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
               (EndNoise *)CONCAT44(local_17c,in_stack_fffffffffffffea0),in_stack_fffffffffffffe9c,
               in_stack_fffffffffffffe98,iVar2,in_stack_fffffffffffffec0);
    sampleNoiseColumnEnd
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
               (EndNoise *)CONCAT44(local_17c,in_stack_fffffffffffffea0),in_stack_fffffffffffffe9c,
               in_stack_fffffffffffffe98,iVar2,in_stack_fffffffffffffec0);
    iVar2 = getSurfaceHeight(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                             in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                             in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,
                             in_stack_ffffffffffffff30,in_stack_fffffffffffffef0,
                             in_stack_fffffffffffffee8);
    iVar1 = getSurfaceHeight(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                             in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                             in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,
                             in_stack_ffffffffffffff30,in_stack_fffffffffffffef0,
                             in_stack_fffffffffffffee8);
    iVar3 = getSurfaceHeight(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                             in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                             in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,
                             in_stack_ffffffffffffff30,in_stack_fffffffffffffef0,
                             in_stack_fffffffffffffee8);
    break;
  case 1:
    sampleNoiseColumnEnd
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
               (EndNoise *)CONCAT44(local_17c,in_stack_fffffffffffffea0),in_stack_fffffffffffffe9c,
               in_stack_fffffffffffffe98,iVar2,in_stack_fffffffffffffec0);
    sampleNoiseColumnEnd
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
               (EndNoise *)CONCAT44(local_17c,in_stack_fffffffffffffea0),in_stack_fffffffffffffe9c,
               in_stack_fffffffffffffe98,iVar2,in_stack_fffffffffffffec0);
    iVar2 = getSurfaceHeight(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                             in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                             in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,
                             in_stack_ffffffffffffff30,in_stack_fffffffffffffef0,
                             in_stack_fffffffffffffee8);
    iVar1 = getSurfaceHeight(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                             in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                             in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,
                             in_stack_ffffffffffffff30,in_stack_fffffffffffffef0,
                             in_stack_fffffffffffffee8);
    iVar3 = getSurfaceHeight(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                             in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                             in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,
                             in_stack_ffffffffffffff30,in_stack_fffffffffffffef0,
                             in_stack_fffffffffffffee8);
    break;
  case 2:
    iVar2 = getSurfaceHeight(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                             in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                             in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,
                             in_stack_ffffffffffffff30,in_stack_fffffffffffffef0,
                             in_stack_fffffffffffffee8);
    iVar1 = getSurfaceHeight(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                             in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                             in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,
                             in_stack_ffffffffffffff30,in_stack_fffffffffffffef0,
                             in_stack_fffffffffffffee8);
    iVar3 = getSurfaceHeight(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                             in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                             in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,
                             in_stack_ffffffffffffff30,in_stack_fffffffffffffef0,
                             in_stack_fffffffffffffee8);
    break;
  case 3:
    sampleNoiseColumnEnd
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
               (EndNoise *)CONCAT44(local_17c,in_stack_fffffffffffffea0),in_stack_fffffffffffffe9c,
               in_stack_fffffffffffffe98,iVar2,in_stack_fffffffffffffec0);
    sampleNoiseColumnEnd
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
               (EndNoise *)CONCAT44(local_17c,in_stack_fffffffffffffea0),in_stack_fffffffffffffe9c,
               in_stack_fffffffffffffe98,iVar2,in_stack_fffffffffffffec0);
    iVar2 = getSurfaceHeight(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                             in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                             in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,
                             in_stack_ffffffffffffff30,in_stack_fffffffffffffef0,
                             in_stack_fffffffffffffee8);
    iVar1 = getSurfaceHeight(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                             in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                             in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,
                             in_stack_ffffffffffffff30,in_stack_fffffffffffffef0,
                             in_stack_fffffffffffffee8);
    iVar3 = getSurfaceHeight(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                             in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                             in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,
                             in_stack_ffffffffffffff30,in_stack_fffffffffffffef0,
                             in_stack_fffffffffffffee8);
    break;
  default:
    return 0;
  }
  if (iVar2 < local_17c) {
    local_17c = iVar2;
  }
  if (iVar1 < local_17c) {
    local_17c = iVar1;
  }
  if (iVar3 < local_17c) {
    local_17c = iVar3;
  }
  if (local_17c < 0x3c) {
    local_17c = 0;
  }
  return local_17c;
}

Assistant:

int isViableEndCityTerrain(const Generator *g, const SurfaceNoise *sn,
        int blockX, int blockZ)
{
    const EndNoise *en = &g->en;
    int chunkX = blockX >> 4;
    int chunkZ = blockZ >> 4;
    blockX = chunkX * 16 + 7;
    blockZ = chunkZ * 16 + 7;
    int cellx = (blockX >> 3);
    int cellz = (blockZ >> 3);

    enum { y0 = 15, y1 = 18, yn = y1-y0+1 };
    double ncol[3][3][yn];

    sampleNoiseColumnEnd(ncol[0][0], sn, en, cellx, cellz, y0, y1);
    sampleNoiseColumnEnd(ncol[0][1], sn, en, cellx, cellz+1, y0, y1);
    sampleNoiseColumnEnd(ncol[1][0], sn, en, cellx+1, cellz, y0, y1);
    sampleNoiseColumnEnd(ncol[1][1], sn, en, cellx+1, cellz+1, y0, y1);

    int h00, h01, h10, h11;
    h00 = getSurfaceHeight(ncol[0][0], ncol[0][1], ncol[1][0], ncol[1][1],
            y0, y1, 4, (blockX & 7) / 8.0, (blockZ & 7) / 8.0);

    uint64_t cs;
    if (en->mc <= MC_1_18)
        setSeed(&cs, chunkX + chunkZ * 10387313ULL);
    else
        cs = chunkGenerateRnd(g->seed, chunkX, chunkZ);

    switch (nextInt(&cs, 4))
    {
    case 0: // (++) 0
        sampleNoiseColumnEnd(ncol[0][2], sn, en, cellx+0, cellz+2, y0, y1);
        sampleNoiseColumnEnd(ncol[1][2], sn, en, cellx+1, cellz+2, y0, y1);
        sampleNoiseColumnEnd(ncol[2][0], sn, en, cellx+2, cellz+0, y0, y1);
        sampleNoiseColumnEnd(ncol[2][1], sn, en, cellx+2, cellz+1, y0, y1);
        sampleNoiseColumnEnd(ncol[2][2], sn, en, cellx+2, cellz+2, y0, y1);
        h01 = getSurfaceHeight(ncol[0][1], ncol[0][2], ncol[1][1], ncol[1][2],
                y0, y1, 4, ((blockX    ) & 7) / 8.0, ((blockZ + 5) & 7) / 8.0);
        h10 = getSurfaceHeight(ncol[1][0], ncol[1][1], ncol[2][0], ncol[2][1],
                y0, y1, 4, ((blockX + 5) & 7) / 8.0, ((blockZ    ) & 7) / 8.0);
        h11 = getSurfaceHeight(ncol[1][1], ncol[1][2], ncol[2][1], ncol[2][2],
                y0, y1, 4, ((blockX + 5) & 7) / 8.0, ((blockZ + 5) & 7) / 8.0);
        break;

    case 1: // (-+) 90
        sampleNoiseColumnEnd(ncol[0][2], sn, en, cellx+0, cellz+2, y0, y1);
        sampleNoiseColumnEnd(ncol[1][2], sn, en, cellx+1, cellz+2, y0, y1);
        h01 = getSurfaceHeight(ncol[0][1], ncol[0][2], ncol[1][1], ncol[1][2],
                y0, y1, 4, ((blockX    ) & 7) / 8.0, ((blockZ + 5) & 7) / 8.0);
        h10 = getSurfaceHeight(ncol[0][0], ncol[0][1], ncol[1][0], ncol[1][1],
                y0, y1, 4, ((blockX - 5) & 7) / 8.0, ((blockZ    ) & 7) / 8.0);
        h11 = getSurfaceHeight(ncol[0][1], ncol[0][2], ncol[1][1], ncol[1][2],
                y0, y1, 4, ((blockX - 5) & 7) / 8.0, ((blockZ + 5) & 7) / 8.0);
        break;

    case 2: // (--) 180
        h01 = getSurfaceHeight(ncol[0][0], ncol[0][1], ncol[1][0], ncol[1][1],
                y0, y1, 4, ((blockX    ) & 7) / 8.0, ((blockZ - 5) & 7) / 8.0);
        h10 = getSurfaceHeight(ncol[0][0], ncol[0][1], ncol[1][0], ncol[1][1],
                y0, y1, 4, ((blockX - 5) & 7) / 8.0, ((blockZ    ) & 7) / 8.0);
        h11 = getSurfaceHeight(ncol[0][0], ncol[0][1], ncol[1][0], ncol[1][1],
                y0, y1, 4, ((blockX - 5) & 7) / 8.0, ((blockZ - 5) & 7) / 8.0);
        break;

    case 3: // (+-) 270
        sampleNoiseColumnEnd(ncol[2][0], sn, en, cellx+2, cellz+0, y0, y1);
        sampleNoiseColumnEnd(ncol[2][1], sn, en, cellx+2, cellz+1, y0, y1);
        h01 = getSurfaceHeight(ncol[0][0], ncol[0][1], ncol[1][0], ncol[1][1],
                y0, y1, 4, ((blockX    ) & 7) / 8.0, ((blockZ - 5) & 7) / 8.0);
        h10 = getSurfaceHeight(ncol[1][0], ncol[1][1], ncol[2][0], ncol[2][1],
                y0, y1, 4, ((blockX + 5) & 7) / 8.0, ((blockZ    ) & 7) / 8.0);
        h11 = getSurfaceHeight(ncol[1][0], ncol[1][1], ncol[2][0], ncol[2][1],
                y0, y1, 4, ((blockX + 5) & 7) / 8.0, ((blockZ - 5) & 7) / 8.0);
        break;

    default:
        return 0; // error
    }
    //printf("%d %d %d %d\n", h00, h01, h10, h11);
    if (h01 < h00) h00 = h01;
    if (h10 < h00) h00 = h10;
    if (h11 < h00) h00 = h11;
    return h00 >= 60 ? h00 : 0;
}